

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<long>(string *__return_storage_ptr__,char *fmt,long *args)

{
  ostringstream local_198 [8];
  ostringstream oss;
  long *args_local;
  char *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  format<long>((ostream *)local_198,fmt,args);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}